

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall fnv_hash_check::test_method(fnv_hash_check *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_138 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
  local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
  local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_int,_const_unsigned_int_&>
  local_98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_78;
  assertion_result local_58;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  uint32_t local_1c [2];
  uint32_t expected;
  uint32_t y;
  uint32_t x;
  fnv_hash_check *this_local;
  
  expected = 0x4d3;
  local_1c[1] = 9999999;
  local_1c[0] = 0xd39f0e56;
  _y = this;
  expected = fnv_hash(0x4d3,9999999);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_30,0x72,&local_40);
    boost::test_tools::assertion_result::assertion_result(&local_58,expected == local_1c[0]);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_118,prev,(char (*) [12])"\nexpected: ");
    boost::unit_test::operator<<(&local_f8,&local_118,local_1c);
    boost::unit_test::operator<<(&local_d8,&local_f8,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<(&local_b8,&local_d8,(char (*) [9])"actual: ");
    boost::unit_test::operator<<(&local_98,&local_b8,&expected);
    boost::unit_test::operator<<(&local_78,&local_98,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_58,&local_78,local_138,0x72,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_78);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_98);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
    ::~lazy_ostream_impl(&local_b8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_d8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_f8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>::
    ~lazy_ostream_impl(&local_118);
    boost::test_tools::assertion_result::~assertion_result(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fnv_hash_check) {
	uint32_t x = 1235U;
	const uint32_t
			y = 9999999U,
			expected = (FNV_PRIME * x) ^y;

	x = fnv_hash(x, y);

	BOOST_REQUIRE_MESSAGE(x == expected,
			"\nexpected: " << expected << "\n"
					<< "actual: " << x << "\n");

}